

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperFastHash.cpp
# Opt level: O2

uint32_t SuperFastHash(char *data,int len,int32_t hash)

{
  ushort *puVar1;
  ushort uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ushort *puVar7;
  
  if (data == (char *)0x0 || len < 1) {
    return 0;
  }
  uVar3 = (ulong)(len & 0x7ffffffc);
  puVar7 = (ushort *)data;
  for (uVar4 = (uint)len >> 2; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
    uVar2 = *puVar7;
    puVar1 = puVar7 + 1;
    puVar7 = puVar7 + 2;
    uVar5 = (hash + (uint)uVar2) * 0x10000 ^ (uint)*puVar1 << 0xb ^ hash + (uint)uVar2;
    hash = uVar5 + ((int)uVar5 >> 0xb);
  }
  switch(len & 3) {
  case 0:
    goto switchD_0016363e_caseD_0;
  case 1:
    uVar4 = (hash + data[uVar3]) * 0x400 ^ hash + data[uVar3];
    iVar6 = (int)uVar4 >> 1;
    break;
  case 2:
    uVar4 = (hash + (uint)*(ushort *)(data + uVar3)) * 0x800 ^
            hash + (uint)*(ushort *)(data + uVar3);
    iVar6 = (int)uVar4 >> 0x11;
    break;
  case 3:
    uVar4 = (hash + (uint)*(ushort *)(data + uVar3)) * 0x10000 ^
            (int)data[uVar3 + 2] << 0x12 ^ hash + (uint)*(ushort *)(data + uVar3);
    hash = ((int)uVar4 >> 0xb) + uVar4;
    goto switchD_0016363e_caseD_0;
  }
  hash = iVar6 + uVar4;
switchD_0016363e_caseD_0:
  uVar4 = hash * 8 ^ hash;
  uVar4 = ((int)uVar4 >> 5) + uVar4;
  uVar4 = uVar4 * 0x10 ^ uVar4;
  uVar4 = ((int)uVar4 >> 0x11) + uVar4;
  uVar4 = uVar4 * 0x2000000 ^ uVar4;
  return ((int)uVar4 >> 6) + uVar4;
}

Assistant:

uint32_t SuperFastHash (const char * data, int len, int32_t hash) {
  uint32_t tmp;
  int rem;

  if (len <= 0 || !data) return 0;

  rem = len & 3;
  len >>= 2;

  /* Main loop */
  for (;len > 0; len--) {
    hash  += get16bits (data);
    tmp    = (get16bits (data+2) << 11) ^ hash;
    hash   = (hash << 16) ^ tmp;
    data  += 2*sizeof (uint16_t);
    hash  += hash >> 11;
  }

  /* Handle end cases */
  switch (rem) {
    case 3:	hash += get16bits (data);
        hash ^= hash << 16;
        hash ^= data[sizeof (uint16_t)] << 18;
        hash += hash >> 11;
        break;
    case 2:	hash += get16bits (data);
        hash ^= hash << 11;
        hash += hash >> 17;
        break;
    case 1: hash += *data;
        hash ^= hash << 10;
        hash += hash >> 1;
  }

  /* Force "avalanching" of final 127 bits */
  hash ^= hash << 3;
  hash += hash >> 5;
  hash ^= hash << 4;
  hash += hash >> 17;
  hash ^= hash << 25;
  hash += hash >> 6;

  return hash;
}